

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O1

void Tcl_DeleteHashEntry(Tcl_HashEntry *entryPtr)

{
  int *piVar1;
  Tcl_HashEntry *pTVar2;
  Tcl_HashEntry *pTVar3;
  long lVar4;
  
  pTVar3 = (Tcl_HashEntry *)entryPtr->bucketPtr;
  do {
    pTVar2 = pTVar3->nextPtr;
    if (pTVar2 == entryPtr) {
      pTVar3->nextPtr = entryPtr->nextPtr;
      piVar1 = &entryPtr->tablePtr->numEntries;
      *piVar1 = *piVar1 + -1;
      free(entryPtr);
      return;
    }
    pTVar3 = pTVar2;
  } while (pTVar2 != (Tcl_HashEntry *)0x0);
  Tcl_DeleteHashEntry_cold_1();
  if (0 < *(int *)&entryPtr[1].nextPtr) {
    lVar4 = 0;
    do {
      pTVar3 = (&entryPtr->nextPtr->nextPtr)[lVar4];
      while (pTVar3 != (Tcl_HashEntry *)0x0) {
        pTVar2 = pTVar3->nextPtr;
        free(pTVar3);
        pTVar3 = pTVar2;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < *(int *)&entryPtr[1].nextPtr);
  }
  if (entryPtr->nextPtr != (Tcl_HashEntry *)&entryPtr->tablePtr) {
    free(entryPtr->nextPtr);
  }
  entryPtr[1].clientData = BogusFind;
  entryPtr[1].key.oneWordValue = (char *)BogusCreate;
  return;
}

Assistant:

void
Tcl_DeleteHashEntry(Tcl_HashEntry *entryPtr)
{
    register Tcl_HashEntry *prevPtr;

    if (*entryPtr->bucketPtr == entryPtr) {
	*entryPtr->bucketPtr = entryPtr->nextPtr;
    } else {
	for (prevPtr = *entryPtr->bucketPtr;; prevPtr = prevPtr->nextPtr) {
	    if (prevPtr == NULL) {
		tcl_panic("malformed bucket chain in Tcl_DeleteHashEntry");
	    }
	    if (prevPtr->nextPtr == entryPtr) {
		prevPtr->nextPtr = entryPtr->nextPtr;
		break;
	    }
	}
    }
    entryPtr->tablePtr->numEntries--;
    free((char *) entryPtr);
}